

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoplus.cpp
# Opt level: O0

void __thiscall EOPlus::op_info_lut_init::op_info_lut_init(op_info_lut_init *this)

{
  byte bVar1;
  logic_error *this_00;
  ulong local_18;
  size_t i;
  op_info_lut_init *this_local;
  
  if (!op_info_lut_init::initialized) {
    op_info_lut_init::initialized = true;
    for (local_18 = 0; local_18 < 0x13; local_18 = local_18 + 1) {
      if (op_info_lut[(ulong)(byte)op_info_table[local_18 * 0x10] * 0x10] != '\0') {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"UOP2 hash collision");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      bVar1 = op_info_table[local_18 * 0x10];
      *(undefined8 *)(op_info_lut + (ulong)bVar1 * 0x10) =
           *(undefined8 *)(op_info_table + local_18 * 0x10);
      *(undefined8 *)(op_info_lut + (ulong)bVar1 * 0x10 + 8) =
           *(undefined8 *)(op_info_table + local_18 * 0x10 + 8);
    }
  }
  return;
}

Assistant:

op_info_lut_init()
		{
			typedef unsigned char uc;
			static bool initialized;

			if (!initialized)
			{
				initialized = true;

				for (std::size_t i = 0; i < sizeof(op_info_table) / sizeof(op_info_table[0]); ++i)
				{
					if (op_info_lut[uc(op_info_table[i].op)].op != Operator(0))
						throw std::logic_error("UOP2 hash collision");

					op_info_lut[uc(op_info_table[i].op)] = op_info_table[i];
				}
			}
		}